

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDX;
  char *in_RSI;
  lua_State *in_RDI;
  luaL_Buffer b;
  size_t l;
  char *wild;
  size_t *in_stack_ffffffffffffdfc0;
  undefined4 in_stack_ffffffffffffdfc8;
  int in_stack_ffffffffffffdfcc;
  luaL_Buffer *in_stack_ffffffffffffdfd0;
  char *local_10;
  
  sVar1 = strlen(in_RDX);
  luaL_buffinit(in_RDI,(luaL_Buffer *)&stack0xffffffffffffdfb8);
  local_10 = in_RSI;
  while( true ) {
    local_10 = strstr(local_10,in_RDX);
    if (local_10 == (char *)0x0) break;
    luaL_addlstring(in_stack_ffffffffffffdfd0,
                    (char *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8),
                    (size_t)in_stack_ffffffffffffdfc0);
    luaL_addstring(in_stack_ffffffffffffdfd0,
                   (char *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8));
    local_10 = local_10 + sVar1;
  }
  luaL_addstring(in_stack_ffffffffffffdfd0,
                 (char *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8));
  luaL_pushresult((luaL_Buffer *)0x129b24);
  pcVar2 = lua_tolstring((lua_State *)in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfcc,
                         in_stack_ffffffffffffdfc0);
  return pcVar2;
}

Assistant:

LUALIB_API const char *luaL_gsub(lua_State *L, const char *s,
				 const char *p, const char *r)
{
  const char *wild;
  size_t l = strlen(p);
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(&b, s, (size_t)(wild - s));  /* push prefix */
    luaL_addstring(&b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after `p' */
  }
  luaL_addstring(&b, s);  /* push last suffix */
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}